

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextQueueDock
               (ImGuiContext *ctx,ImGuiWindow *target,ImGuiDockNode *target_node,
               ImGuiWindow *payload,ImGuiDir split_dir,float split_ratio,bool split_outer)

{
  undefined1 local_78 [8];
  ImGuiDockRequest req;
  bool split_outer_local;
  float split_ratio_local;
  ImGuiDir split_dir_local;
  ImGuiWindow *payload_local;
  ImGuiDockNode *target_node_local;
  ImGuiWindow *target_local;
  ImGuiContext *ctx_local;
  
  req.UndockTargetNode._7_1_ = split_outer;
  if (target != payload) {
    ImGuiDockRequest::ImGuiDockRequest((ImGuiDockRequest *)local_78);
    local_78._0_4_ = ImGuiDockRequestType_Dock;
    req.DockSplitDir._0_1_ = req.UndockTargetNode._7_1_ & 1;
    req._0_8_ = target;
    req.DockTargetWindow = (ImGuiWindow *)target_node;
    req.DockTargetNode = (ImGuiDockNode *)payload;
    req.DockPayload._0_4_ = split_dir;
    req.DockPayload._4_4_ = split_ratio;
    ImVector<ImGuiDockRequest>::push_back(&(ctx->DockContext).Requests,(ImGuiDockRequest *)local_78)
    ;
    return;
  }
  __assert_fail("target != payload",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x336b,
                "void ImGui::DockContextQueueDock(ImGuiContext *, ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDir, float, bool)"
               );
}

Assistant:

void ImGui::DockContextQueueDock(ImGuiContext* ctx, ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, float split_ratio, bool split_outer)
{
    IM_ASSERT(target != payload);
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Dock;
    req.DockTargetWindow = target;
    req.DockTargetNode = target_node;
    req.DockPayload = payload;
    req.DockSplitDir = split_dir;
    req.DockSplitRatio = split_ratio;
    req.DockSplitOuter = split_outer;
    ctx->DockContext.Requests.push_back(req);
}